

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lecturedemomesh.cc
# Opt level: O3

void lecturedemo::PrintGeometryInfo(Mesh *mesh,dim_t codim)

{
  PointerType pdVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  Index IVar4;
  Index IVar5;
  undefined1 uVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  long *plVar9;
  MatrixXd *pMVar10;
  ostream *poVar11;
  long extraout_RDX;
  ulong i;
  MatrixXd corners;
  stringstream ss;
  string local_268;
  string local_248;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  variable_if_dynamic<long,__1> local_208;
  variable_if_dynamic<long,__1> vStack_200;
  Index local_1f8;
  size_type local_1ec;
  undefined8 *local_1e8;
  Mesh *local_1e0;
  undefined8 *local_1d8;
  Matrix<double,__1,__1,_0,__1,__1> local_1d0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  long local_198;
  long lStack_190;
  Index local_188;
  
  uVar7 = (**mesh->_vptr_Mesh)();
  if (uVar7 < codim) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"codim ",6);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," too large",10);
    pdVar1 = (PointerType)(local_228 + 0x10);
    local_228._0_8_ = pdVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_228,"(codim <= mesh.DimMesh())","");
    paVar2 = &local_268.field_2;
    local_268._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed((string *)local_228,&local_268,0x5d,&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((PointerType)local_228._0_8_ != pdVar1) {
      operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
    }
    local_228._0_8_ = pdVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"false","");
    local_268._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
               ,"");
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
    lf::base::AssertionFailed((string *)local_228,&local_268,0x5d,&local_248);
LAB_0013ad27:
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)local_228);
    abort();
  }
  local_1e0 = mesh;
  iVar8 = (*mesh->_vptr_Mesh[2])(mesh,codim);
  local_1d8 = (undefined8 *)CONCAT44(extraout_var,iVar8);
  if (extraout_RDX != 0) {
    local_1e8 = local_1d8 + extraout_RDX;
    do {
      plVar3 = (long *)*local_1d8;
      uVar6 = (**(code **)(*plVar3 + 0x20))(plVar3);
      local_1b8[0] = uVar6;
      local_1ec = lf::base::RefEl::NumNodes((RefEl *)local_1b8);
      plVar9 = (long *)(**(code **)(*plVar3 + 0x18))(plVar3);
      if (plVar9 == (long *)0x0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"Missing geometry!",0x11);
        pdVar1 = (PointerType)(local_228 + 0x10);
        local_228._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"geo_ptr != nullptr","")
        ;
        paVar2 = &local_268.field_2;
        local_268._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        lf::base::AssertionFailed((string *)local_228,&local_268,100,&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((PointerType)local_228._0_8_ != pdVar1) {
          operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
        }
        local_228._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"false","");
        local_268._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
                   ,"");
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
        lf::base::AssertionFailed((string *)local_228,&local_268,100,&local_248);
        goto LAB_0013ad27;
      }
      uVar6 = (**(code **)(*plVar9 + 0x10))(plVar9);
      local_1b8[0] = uVar6;
      pMVar10 = lf::base::RefEl::NodeCoords((RefEl *)local_1b8);
      (**(code **)(*plVar9 + 0x18))(&local_1d0,plVar9,pMVar10);
      IVar4 = local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows;
      uVar7 = (**(code **)(*plVar9 + 8))(plVar9);
      IVar5 = local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
      if (IVar4 != (ulong)uVar7) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"dimension mismatch for coordinate vectors",0x29);
        pdVar1 = (PointerType)(local_228 + 0x10);
        local_228._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,"corners.rows() == geo_ptr->DimGlobal()","");
        paVar2 = &local_268.field_2;
        local_268._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        lf::base::AssertionFailed((string *)local_228,&local_268,0x68,&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((PointerType)local_228._0_8_ != pdVar1) {
          operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
        }
        local_228._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"false","");
        local_268._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
                   ,"");
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
        lf::base::AssertionFailed((string *)local_228,&local_268,0x68,&local_248);
        goto LAB_0013ad27;
      }
      if (local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols != (ulong)local_1ec) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"#corners mismath",0x10);
        pdVar1 = (PointerType)(local_228 + 0x10);
        local_228._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,"corners.cols() == num_nodes","");
        paVar2 = &local_268.field_2;
        local_268._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        lf::base::AssertionFailed((string *)local_228,&local_268,0x69,&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((PointerType)local_228._0_8_ != pdVar1) {
          operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
        }
        local_228._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"false","");
        local_268._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
                   ,"");
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
        lf::base::AssertionFailed((string *)local_228,&local_268,0x69,&local_248);
        goto LAB_0013ad27;
      }
      uVar6 = (**(code **)(*plVar3 + 0x20))(plVar3);
      local_228[0] = uVar6;
      lf::base::RefEl::ToString_abi_cxx11_((string *)local_1b8,(RefEl *)local_228);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_1b8._0_8_,local_1b8._8_8_);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(",1);
      (*local_1e0->_vptr_Mesh[5])(local_1e0,plVar3);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,") pts: ",7);
      if (local_1ec != 0) {
        i = 0;
        do {
          poVar11 = (ostream *)std::ostream::operator<<(&std::cout,(int)i);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," =[",3);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_228,
                     &local_1d0,i);
          local_188 = local_1f8;
          local_198 = local_208.m_value;
          lStack_190 = vStack_200.m_value;
          local_1a8._M_allocated_capacity = local_218._M_allocated_capacity;
          local_1a8._8_8_ = local_218._8_8_;
          local_1b8._0_8_ = local_228._0_8_;
          local_1b8._8_8_ = local_228._8_8_;
          poVar11 = Eigen::operator<<(poVar11,(DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                                               *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"], ",3);
          i = i + 1;
        } while (IVar5 != i);
      }
      local_1b8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_1b8,1);
      free(local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      local_1d8 = local_1d8 + 1;
    } while (local_1d8 != local_1e8);
  }
  return;
}

Assistant:

void PrintGeometryInfo(const lf::mesh::Mesh &mesh, dim_t codim) {
  LF_ASSERT_MSG((codim <= mesh.DimMesh()),
		"codim " << +codim << " too large");
  // loop over all entities of the specified codimension
  for (const lf::mesh::Entity* ent : mesh.Entities(codim)) {
    // Number of nodes = number of corner points
    const size_type num_nodes = ent->RefEl().NumNodes();
    // Obtain pointer to geometry object associated with entity
    const lf::geometry::Geometry *geo_ptr = ent->Geometry();
    LF_ASSERT_MSG(geo_ptr != nullptr, "Missing geometry!");
    // Fetch coordinates of corner points in packed format \cref{par:coords}
    Eigen::MatrixXd corners = lf::geometry::Corners(*geo_ptr);
    LF_ASSERT_MSG(corners.rows() == geo_ptr->DimGlobal(),
                  "dimension mismatch for coordinate vectors");
    LF_ASSERT_MSG(corners.cols() == num_nodes, "#corners mismath");
    std::cout << ent->RefEl() << "(" << mesh.Index(*ent) << ") pts: ";
    for (int l = 0; l < num_nodes; ++l) {
      std::cout << l << " =[" << corners.col(l).transpose() << "], ";
    }
    std::cout << '\n';
  }}